

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void Catch::Clara::Detail::convertInto<int>(string *_source,int *_dest)

{
  runtime_error *this;
  long *plVar1;
  long *plVar2;
  stringstream ss;
  long *local_1e8;
  long local_1e0;
  long local_1d8;
  long lStack_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  long local_1a8 [2];
  ostream local_198 [16];
  byte abStack_188 [96];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_198,(_source->_M_dataplus)._M_p,_source->_M_string_length);
  std::istream::operator>>((istream *)local_1a8,_dest);
  if ((abStack_188[*(long *)(local_1a8[0] + -0x18)] & 5) == 0) {
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
    std::ios_base::~ios_base(local_128);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_1c8,"Unable to convert ",_source);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_1c8);
  local_1e8 = (long *)*plVar1;
  plVar2 = plVar1 + 2;
  if (local_1e8 == plVar2) {
    local_1d8 = *plVar2;
    lStack_1d0 = plVar1[3];
    local_1e8 = &local_1d8;
  }
  else {
    local_1d8 = *plVar2;
  }
  local_1e0 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::runtime_error::runtime_error(this,(string *)&local_1e8);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void convertInto( std::string const& _source, T& _dest ) {
            std::stringstream ss;
            ss << _source;
            ss >> _dest;
            if( ss.fail() )
                throw std::runtime_error( "Unable to convert " + _source + " to destination type" );
        }